

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRST.cxx
# Opt level: O1

int testRST(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool ret;
  int iVar3;
  ostream *poVar4;
  void *this;
  int iVar5;
  bool a_eol;
  bool e_eol;
  string fname;
  string a_line;
  string e_name;
  string a_name;
  string dir;
  ifstream a_fin;
  ifstream e_fin;
  bool local_dca;
  bool local_dc9;
  string local_dc8;
  string local_da8;
  long *local_d88;
  long local_d80;
  long local_d78 [2];
  long *local_d68;
  long local_d60;
  long local_d58 [2];
  string local_d48;
  string local_d28;
  string local_d08;
  undefined1 local_ce8 [16];
  streambuf local_cd8 [16];
  byte abStack_cc8 [216];
  ios_base local_bf0 [272];
  cmRST local_ae0;
  
  if (argc != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Usage: testRST <dir>",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string((string *)&local_d48,argv[1],(allocator *)&local_ae0);
  if (local_d48._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_d48,0,(char *)0x0,0x1eb586);
  }
  local_d68 = local_d58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d68,"testRST.actual","");
  local_d88 = local_d78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d88,local_d48._M_dataplus._M_p,
             local_d48._M_dataplus._M_p + local_d48._M_string_length);
  std::__cxx11::string::append((char *)&local_d88);
  paVar1 = &local_dc8.field_2;
  local_dc8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_dc8,local_d48._M_dataplus._M_p,
             local_d48._M_dataplus._M_p + local_d48._M_string_length);
  std::__cxx11::string::append((char *)&local_dc8);
  std::ofstream::ofstream(local_ce8,(char *)local_d68,_S_out);
  if ((abStack_cc8[(long)*(_func_int **)(local_ce8._0_8_ + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open output ",0x16);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_d68,local_d60);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    local_ce8._0_8_ = _VTT;
    *(undefined8 *)(local_ce8 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_ce8 + 8));
    std::ios_base::~ios_base(local_bf0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_dc8._M_dataplus._M_p != paVar1) {
      operator_delete(local_dc8._M_dataplus._M_p,
                      CONCAT71(local_dc8.field_2._M_allocated_capacity._1_7_,
                               local_dc8.field_2._M_local_buf[0]) + 1);
    }
    iVar5 = 1;
    goto LAB_0012bef9;
  }
  cmRST::cmRST(&local_ae0,(ostream *)local_ce8,&local_d48);
  bVar2 = cmRST::ProcessFile(&local_ae0,&local_dc8,false);
  if (bVar2) {
    cmRST::~cmRST(&local_ae0);
    local_ce8._0_8_ = _VTT;
    *(undefined8 *)(local_ce8 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_ce8 + 8));
    std::ios_base::~ios_base(local_bf0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_dc8._M_dataplus._M_p != paVar1) {
      operator_delete(local_dc8._M_dataplus._M_p,
                      CONCAT71(local_dc8.field_2._M_allocated_capacity._1_7_,
                               local_dc8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open input ",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_dc8._M_dataplus._M_p,local_dc8._M_string_length)
    ;
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    cmRST::~cmRST(&local_ae0);
    local_ce8._0_8_ = _VTT;
    *(undefined8 *)(local_ce8 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_ce8 + 8));
    std::ios_base::~ios_base(local_bf0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_dc8._M_dataplus._M_p != paVar1) {
      operator_delete(local_dc8._M_dataplus._M_p,
                      CONCAT71(local_dc8.field_2._M_allocated_capacity._1_7_,
                               local_dc8.field_2._M_local_buf[0]) + 1);
    }
    iVar5 = 1;
    if (!bVar2) goto LAB_0012bef9;
  }
  std::ifstream::ifstream(&local_ae0,(char *)local_d88,_S_in);
  std::ifstream::ifstream(local_ce8,(char *)local_d68,_S_in);
  if ((*(byte *)((long)local_ae0.CMakeDirective.startp +
                *(long *)&local_ae0.OS[-1].field_0xf8 + -0x18) & 5) == 0) {
    if ((abStack_cc8[(long)*(_func_int **)(local_ce8._0_8_ + -0x18)] & 5) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not open input ",0x15);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_d68,local_d60);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      goto LAB_0012bec7;
    }
    iVar5 = 1;
    do {
      local_dc8._M_string_length = 0;
      local_dc8.field_2._M_local_buf[0] = '\0';
      local_da8._M_dataplus._M_p = (pointer)&local_da8.field_2;
      local_da8._M_string_length = 0;
      local_da8.field_2._M_local_buf[0] = '\0';
      local_dc8._M_dataplus._M_p = (pointer)paVar1;
      bVar2 = cmsys::SystemTools::GetLineFromStream((istream *)&local_ae0,&local_dc8,&local_dc9,-1);
      ret = cmsys::SystemTools::GetLineFromStream((istream *)local_ce8,&local_da8,&local_dca,-1);
      if ((((bVar2 != ret) || (local_dc8._M_string_length != local_da8._M_string_length)) ||
          ((local_dc8._M_string_length != 0 &&
           (iVar3 = bcmp(local_dc8._M_dataplus._M_p,local_da8._M_dataplus._M_p,
                         local_dc8._M_string_length), iVar3 != 0)))) || (local_dc9 != local_dca)) {
        std::istream::seekg((long)local_ce8,_S_beg);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Actual output does not match that expected on line ",0x33)
        ;
        poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        poVar4 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Expected ",9);
        local_d08._M_dataplus._M_p = (pointer)&local_d08.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d08,local_dc8._M_dataplus._M_p,
                   local_dc8._M_dataplus._M_p + local_dc8._M_string_length);
        reportLine((ostream *)&std::cerr,bVar2,&local_d08,local_dc9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
          operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," but got ",9);
        local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d28,local_da8._M_dataplus._M_p,
                   local_da8._M_dataplus._M_p + local_da8._M_string_length);
        reportLine((ostream *)&std::cerr,ret,&local_d28,local_dca);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
          operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,".",1);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
        std::ostream::put(-8);
        poVar4 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Actual output:",0xe);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        this = (void *)std::ostream::flush();
        std::ostream::operator<<(this,local_cd8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_da8._M_dataplus._M_p != &local_da8.field_2) {
          operator_delete(local_da8._M_dataplus._M_p,
                          CONCAT71(local_da8.field_2._M_allocated_capacity._1_7_,
                                   local_da8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_dc8._M_dataplus._M_p != paVar1) {
          operator_delete(local_dc8._M_dataplus._M_p,
                          CONCAT71(local_dc8.field_2._M_allocated_capacity._1_7_,
                                   local_dc8.field_2._M_local_buf[0]) + 1);
        }
        iVar5 = 1;
        goto LAB_0012bedf;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_da8._M_dataplus._M_p != &local_da8.field_2) {
        operator_delete(local_da8._M_dataplus._M_p,
                        CONCAT71(local_da8.field_2._M_allocated_capacity._1_7_,
                                 local_da8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dc8._M_dataplus._M_p != paVar1) {
        operator_delete(local_dc8._M_dataplus._M_p,
                        CONCAT71(local_dc8.field_2._M_allocated_capacity._1_7_,
                                 local_dc8.field_2._M_local_buf[0]) + 1);
      }
      iVar5 = iVar5 + 1;
    } while (bVar2 && ret);
    iVar5 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open input ",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_d88,local_d80);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
LAB_0012bec7:
    std::ostream::put((char)poVar4);
    iVar5 = 1;
    std::ostream::flush();
  }
LAB_0012bedf:
  std::ifstream::~ifstream(local_ce8);
  std::ifstream::~ifstream(&local_ae0);
LAB_0012bef9:
  if (local_d88 != local_d78) {
    operator_delete(local_d88,local_d78[0] + 1);
  }
  if (local_d68 != local_d58) {
    operator_delete(local_d68,local_d58[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
    operator_delete(local_d48._M_dataplus._M_p,local_d48.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

int testRST(int argc, char* argv[])
{
  if(argc != 2)
    {
    std::cerr << "Usage: testRST <dir>" << std::endl;
    return 1;
    }
  std::string dir = argv[1];
  if(dir.empty())
    {
    dir = ".";
    }
  std::string a_name = "testRST.actual";
  std::string e_name = dir + "/testRST.expect";

  // Process the test RST file.
  {
  std::string fname = dir + "/testRST.rst";
  std::ofstream fout(a_name.c_str());
  if(!fout)
    {
    std::cerr << "Could not open output " << a_name << std::endl;
    return 1;
    }

  cmRST r(fout, dir);
  if(!r.ProcessFile(fname))
    {
    std::cerr << "Could not open input " << fname << std::endl;
    return 1;
    }
  }

  // Compare expected and actual outputs.
  std::ifstream e_fin(e_name.c_str());
  std::ifstream a_fin(a_name.c_str());
  if(!e_fin)
    {
    std::cerr << "Could not open input " << e_name << std::endl;
    return 1;
    }
  if(!a_fin)
    {
    std::cerr << "Could not open input " << a_name << std::endl;
    return 1;
    }
  int lineno = 0;
  bool e_ret;
  bool a_ret;
  do
    {
    std::string e_line;
    std::string a_line;
    bool e_eol;
    bool a_eol;
    e_ret = cmSystemTools::GetLineFromStream(e_fin, e_line, &e_eol);
    a_ret = cmSystemTools::GetLineFromStream(a_fin, a_line, &a_eol);
    ++lineno;
    if(e_ret != a_ret || e_line != a_line || e_eol != a_eol)
      {
      a_fin.seekg(0, std::ios::beg);
      std::cerr << "Actual output does not match that expected on line "
                << lineno << "." << std::endl << "Expected ";
      reportLine(std::cerr, e_ret, e_line, e_eol);
      std::cerr << " but got ";
      reportLine(std::cerr, a_ret, a_line, a_eol);
      std::cerr << "." << std::endl
                << "Actual output:" << std::endl
                << a_fin.rdbuf();
      return 1;
      }
    } while(e_ret && a_ret);
  return 0;
}